

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_> *
__thiscall
llvm::DWARFDie::getAddressRanges
          (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
           *__return_storage_ptr__,DWARFDie *this)

{
  DWARFUnit *this_00;
  bool bVar1;
  DWARFAbbreviationDeclaration *pDVar2;
  initializer_list<llvm::DWARFAddressRange> __l;
  Optional<unsigned_long> OVar3;
  DWARFAddressRange local_90;
  undefined1 auStack_78 [8];
  Optional<llvm::DWARFFormValue> Value;
  uint64_t LowPC;
  uint64_t HighPC;
  uint64_t Index;
  
  pDVar2 = getAbbreviationDeclarationPtr(this);
  if (pDVar2 != (DWARFAbbreviationDeclaration *)0x0) {
    bVar1 = getLowAndHighPC(this,(uint64_t *)&Value.Storage.hasVal,&LowPC,&HighPC);
    if (bVar1) {
      local_90.LowPC = Value.Storage._48_8_;
      local_90.HighPC = LowPC;
      local_90.SectionIndex = HighPC;
      __l._M_len = 1;
      __l._M_array = &local_90;
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::vector
                ((vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)
                 auStack_78,__l,(allocator_type *)((long)&Index + 7));
      __return_storage_ptr__->field_0x18 = __return_storage_ptr__->field_0x18 & 0xfe;
      *(ulong *)(__return_storage_ptr__->field_0).ErrorStorage.buffer =
           CONCAT62(auStack_78._2_6_,auStack_78._0_2_);
      *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = Value.Storage.field_0._0_8_;
      *(anon_union_8_3_82d75f4a_for_ValueType_0 *)((long)&__return_storage_ptr__->field_0 + 0x10) =
           Value.Storage.field_0.value.Value.field_0;
      return __return_storage_ptr__;
    }
    find((Optional<llvm::DWARFFormValue> *)auStack_78,this,DW_AT_ranges);
    if (Value.Storage.field_0._40_1_ == '\x01') {
      this_00 = this->U;
      OVar3 = DWARFFormValue::getAsSectionOffset((DWARFFormValue *)auStack_78);
      if (auStack_78._0_2_ == DW_FORM_rnglistx) {
        if (((undefined1  [16])OVar3.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          DWARFUnit::findRnglistFromIndex
                    (__return_storage_ptr__,this_00,OVar3.Storage.field_0._0_4_);
          return __return_storage_ptr__;
        }
      }
      else if (((undefined1  [16])OVar3.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        DWARFUnit::findRnglistFromOffset(__return_storage_ptr__,this_00,OVar3.Storage.field_0.value)
        ;
        return __return_storage_ptr__;
      }
      __assert_fail("hasVal",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                    ,0xad,
                    "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                   );
    }
  }
  __return_storage_ptr__->field_0x18 = __return_storage_ptr__->field_0x18 & 0xfe;
  *(undefined8 *)(__return_storage_ptr__->field_0).ErrorStorage.buffer = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = 0;
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFAddressRangesVector> DWARFDie::getAddressRanges() const {
  if (isNULL())
    return DWARFAddressRangesVector();
  // Single range specified by low/high PC.
  uint64_t LowPC, HighPC, Index;
  if (getLowAndHighPC(LowPC, HighPC, Index))
    return DWARFAddressRangesVector{{LowPC, HighPC, Index}};

  Optional<DWARFFormValue> Value = find(DW_AT_ranges);
  if (Value) {
    if (Value->getForm() == DW_FORM_rnglistx)
      return U->findRnglistFromIndex(*Value->getAsSectionOffset());
    return U->findRnglistFromOffset(*Value->getAsSectionOffset());
  }
  return DWARFAddressRangesVector();
}